

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolve.c
# Opt level: O0

int valequal(lys_node *node,char *noncan_val,int noncan_val_len,char *can_val)

{
  int iVar1;
  lys_type *plVar2;
  lys_node *local_88;
  lys_node_leaf *sleaf;
  lyd_node_leaf_list leaf;
  int ret;
  char *can_val_local;
  int noncan_val_len_local;
  char *noncan_val_local;
  lys_node *node_local;
  
  memset(&sleaf,0,0x50);
  leaf._48_8_ = lydict_insert(node->module->ctx,noncan_val,(long)noncan_val_len);
  local_88 = node;
  do {
    leaf.value.int32 = *(undefined4 *)&local_88[1].ref;
    sleaf = (lys_node_leaf *)node;
    if (leaf.value.int32 != 9) {
      plVar2 = lyp_parse_value((lys_type *)&local_88[1].ref,(char **)&leaf.hash,(lyxml_elem *)0x0,
                               (lyd_node_leaf_list *)&sleaf,(lyd_attr *)0x0,(lys_module *)0x0,0,0,0)
      ;
      if (plVar2 == (lys_type *)0x0) {
        leaf.value_flags = 0xff;
        leaf._77_3_ = 0xffffff;
      }
      else {
        iVar1 = strcmp((char *)leaf._48_8_,can_val);
        leaf._77_3_ = 0;
        leaf.value_flags = iVar1 == 0;
      }
LAB_0012a186:
      lydict_remove(node->module->ctx,(char *)leaf._48_8_);
      return leaf._76_4_;
    }
    if (*(long *)&local_88[1].nodetype == 0) {
      ly_log(node->module->ctx,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
             "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/resolve.c"
             ,0x1146);
      leaf.value_flags = 0xff;
      leaf._77_3_ = 0xffffff;
      goto LAB_0012a186;
    }
    local_88 = *(lys_node **)&local_88[1].nodetype;
  } while( true );
}

Assistant:

static int
valequal(struct lys_node *node, const char *noncan_val, int noncan_val_len, const char *can_val)
{
    int ret;
    struct lyd_node_leaf_list leaf;
    struct lys_node_leaf *sleaf = (struct lys_node_leaf*)node;

    /* dummy leaf */
    memset(&leaf, 0, sizeof leaf);
    leaf.value_str = lydict_insert(node->module->ctx, noncan_val, noncan_val_len);

repeat:
    leaf.value_type = sleaf->type.base;
    leaf.schema = node;

    if (leaf.value_type == LY_TYPE_LEAFREF) {
        if (!sleaf->type.info.lref.target) {
            /* it should either be unresolved leafref (leaf.value_type are ORed flags) or it will be resolved */
            LOGINT(node->module->ctx);
            ret = -1;
            goto finish;
        }
        sleaf = sleaf->type.info.lref.target;
        goto repeat;
    } else {
        if (!lyp_parse_value(&sleaf->type, &leaf.value_str, NULL, &leaf, NULL, NULL, 0, 0, 0)) {
            ret = -1;
            goto finish;
        }
    }

    if (!strcmp(leaf.value_str, can_val)) {
        ret = 1;
    } else {
        ret = 0;
    }

finish:
    lydict_remove(node->module->ctx, leaf.value_str);
    return ret;
}